

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::set_alpha_from_mask_color(Image *this,uint64_t r,uint64_t g,uint64_t b)

{
  long lVar1;
  long lVar2;
  uint64_t a;
  long y;
  long x;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar1 = this->height;
  if (0 < lVar1) {
    lVar2 = this->width;
    y = 0;
    do {
      if (0 < lVar2) {
        x = 0;
        do {
          read_pixel(this,x,y,&local_38,&local_40,&local_48,(uint64_t *)0x0);
          a = 0;
          if (local_48 != b || (local_40 != g || local_38 != r)) {
            a = this->max_value;
          }
          write_pixel(this,x,y,local_38,local_40,local_48,a);
          x = x + 1;
        } while (lVar2 != x);
      }
      y = y + 1;
    } while (y != lVar1);
  }
  return;
}

Assistant:

void Image::set_alpha_from_mask_color(uint64_t r, uint64_t g, uint64_t b) {
  ssize_t w = this->get_width();
  ssize_t h = this->get_height();
  for (ssize_t y = 0; y < h; y++) {
    for (ssize_t x = 0; x < w; x++) {
      uint64_t sr, sg, sb;
      this->read_pixel(x, y, &sr, &sg, &sb);
      uint64_t a = (sr == r && sg == g && sb == b) ? 0 : this->max_value;
      this->write_pixel(x, y, sr, sg, sb, a);
    }
  }
}